

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O0

void __thiscall caldate_t::julian_date(caldate_t *this,int *jy,int *jm,int *jd)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  double dVar3;
  double dVar4;
  int32_t e;
  int32_t d;
  int32_t c;
  int32_t b;
  int32_t a;
  int32_t z;
  undefined4 local_40;
  undefined4 local_3c;
  
  dVar3 = julian_dayno((caldate_t *)0x2f5e92);
  dVar3 = floor(dVar3 + 0.5);
  iVar1 = (int)dVar3 + 0x5f4;
  dVar3 = floor(((double)iVar1 - 122.1) / 365.25);
  local_40 = (int)dVar3;
  dVar3 = floor((double)local_40 * 365.25);
  dVar4 = floor((double)(iVar1 - (int)dVar3) / 30.6001);
  iVar2 = (int)dVar4;
  if (iVar2 < 0xe) {
    local_3c = iVar2 + -1;
  }
  else {
    local_3c = iVar2 + -0xd;
  }
  *in_RDX = local_3c;
  if (*in_RDX < 3) {
    local_40 = local_40 + -0x126b;
  }
  else {
    local_40 = local_40 + -0x126c;
  }
  *in_RSI = local_40;
  dVar4 = floor((double)iVar2 * 30.6001);
  *in_RCX = (iVar1 - (int)dVar3) - (int)dVar4;
  return;
}

Assistant:

void julian_date(int &jy, int &jm, int &jd)
    {
        int32_t z = (int32_t)floor(julian_dayno() + 0.5);

        int32_t a = z;
        int32_t b = a + 1524;
        int32_t c = (int32_t)floor((b - 122.1) / 365.25);
        int32_t d = (int32_t)floor(365.25 * c);
        int32_t e = (int32_t)floor((b - d) / 30.6001);

        jm = e < 14 ? e - 1 : e - 13;
        jy = jm > 2 ? c - 4716 : c - 4715;
        jd = b - d - (int32_t)floor(30.6001 * e);
    }